

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip324.cpp
# Opt level: O1

void __thiscall
BIP324Cipher::Encrypt
          (BIP324Cipher *this,Span<const_std::byte> contents,Span<const_std::byte> aad,bool ignore,
          Span<std::byte> output)

{
  Span<std::byte> cipher;
  long in_FS_OFFSET;
  Span<const_std::byte> input;
  Span<const_std::byte> plain1;
  Span<std::byte> output_00;
  byte header [1];
  byte len [3];
  byte local_3c;
  byte local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (output.m_size != contents.m_size + 0x14) {
    __assert_fail("output.size() == contents.size() + EXPANSION",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/bip324.cpp"
                  ,0x4b,
                  "void BIP324Cipher::Encrypt(Span<const std::byte>, Span<const std::byte>, bool, Span<std::byte>)"
                 );
  }
  local_3b = (byte)contents.m_size;
  local_3a = contents.m_size._1_1_;
  local_39 = contents.m_size._2_1_;
  input.m_size = 3;
  input.m_data = &local_3b;
  output_00.m_size = 3;
  output_00.m_data = output.m_data;
  FSChaCha20::Crypt((FSChaCha20 *)this,input,output_00);
  local_3c = ignore << 7;
  cipher.m_size = output.m_size - 3;
  cipher.m_data = output.m_data + 3;
  plain1.m_size = 1;
  plain1.m_data = &local_3c;
  FSChaCha20Poly1305::Encrypt
            ((FSChaCha20Poly1305 *)&this->m_send_p_cipher,plain1,contents,aad,cipher);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BIP324Cipher::Encrypt(Span<const std::byte> contents, Span<const std::byte> aad, bool ignore, Span<std::byte> output) noexcept
{
    assert(output.size() == contents.size() + EXPANSION);

    // Encrypt length.
    std::byte len[LENGTH_LEN];
    len[0] = std::byte{(uint8_t)(contents.size() & 0xFF)};
    len[1] = std::byte{(uint8_t)((contents.size() >> 8) & 0xFF)};
    len[2] = std::byte{(uint8_t)((contents.size() >> 16) & 0xFF)};
    m_send_l_cipher->Crypt(len, output.first(LENGTH_LEN));

    // Encrypt plaintext.
    std::byte header[HEADER_LEN] = {ignore ? IGNORE_BIT : std::byte{0}};
    m_send_p_cipher->Encrypt(header, contents, aad, output.subspan(LENGTH_LEN));
}